

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseCWL.cpp
# Opt level: O3

void extractStructureLevel(Classification *result,string *c,size_t *i)

{
  int iVar1;
  pointer pcVar2;
  long *__nptr;
  int *piVar3;
  long lVar4;
  undefined8 uVar5;
  ulong uVar6;
  string level;
  long *local_50;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  uVar6 = *i;
  pcVar2 = (c->_M_dataplus)._M_p;
  if (pcVar2[uVar6] != '-') goto LAB_0017c195;
  do {
    uVar6 = uVar6 + 1;
    *i = uVar6;
LAB_0017c195:
    if (c->_M_string_length <= uVar6) goto LAB_0017c1b5;
  } while ((int)pcVar2[uVar6] - 0x30U < 10);
  *i = uVar6 - 1;
LAB_0017c1b5:
  std::__cxx11::string::substr((ulong)&local_48,(ulong)c);
  __nptr = local_48;
  if (local_40 == 0) {
LAB_0017c218:
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    return;
  }
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  lVar4 = strtol((char *)__nptr,(char **)&local_50,10);
  if (local_50 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar4 == lVar4) && (*piVar3 != 0x22)) {
    if (*piVar3 == 0) {
      *piVar3 = iVar1;
    }
    result->sectionLevel = (int)lVar4 + -1;
    goto LAB_0017c218;
  }
  uVar5 = std::__throw_out_of_range("stoi");
  if (*piVar3 == 0) {
    *piVar3 = iVar1;
  }
  extractStructureLevel();
  _Unwind_Resume(uVar5);
}

Assistant:

void extractStructureLevel (Classification &result, string &c, size_t &i) {
    auto start = i;
    if (c[i] == '-') { i++; }
    for (; i < c.size(); i++) {
        if (!isdigit(c[i])) { i--; break; } // i will be incremented after
    }

    string level = c.substr(start, i - start);
    if (level.empty()) { return; }

    result.sectionLevel = std::stoi(level) - 1;
}